

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall
ON_3dVector::PerpendicularTo(ON_3dVector *this,ON_3dPoint *P0,ON_3dPoint *P1,ON_3dPoint *P2)

{
  bool bVar1;
  ON_3dVector *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector N2;
  ON_3dVector N0;
  ON_3dVector N1;
  ON_3dVector V2;
  ON_3dVector V0;
  ON_3dVector V1;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  ON_3dVector local_b0;
  ON_3dVector local_98;
  ON_3dVector local_80;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  ON_3dVector local_48;
  
  this->z = ZeroVector.z;
  dVar3 = ZeroVector.y;
  this->x = ZeroVector.x;
  this->y = dVar3;
  ON_3dPoint::operator-(&local_80,P2,P1);
  ON_3dPoint::operator-(&local_48,P0,P2);
  ON_3dPoint::operator-(&local_98,P1,P0);
  ON_CrossProduct(&local_c8,&local_48,&local_98);
  bVar1 = Unitize(&local_c8);
  if (bVar1) {
    ON_CrossProduct(&local_b0,&local_98,&local_80);
    bVar1 = Unitize(&local_b0);
    if (bVar1) {
      ON_CrossProduct(&local_e0,&local_80,&local_48);
      bVar1 = Unitize(&local_e0);
      if (!bVar1) {
        return bVar1;
      }
      local_58 = Length(&local_80);
      local_58 = 1.0 / local_58;
      uStack_50 = 0;
      local_68 = Length(&local_48);
      local_68 = 1.0 / local_68;
      uStack_60 = 0;
      dVar3 = Length(&local_98);
      dVar3 = 1.0 / dVar3;
      dVar4 = dVar3 * ABS(local_98.z * local_c8.z +
                          local_98.x * local_c8.x + local_98.y * local_c8.y) +
              local_58 *
              ABS(local_80.z * local_c8.z + local_80.x * local_c8.x + local_80.y * local_c8.y) +
              local_68 *
              ABS(local_48.z * local_c8.z + local_48.x * local_c8.x + local_48.y * local_c8.y);
      dVar5 = dVar3 * ABS(local_98.z * local_b0.z +
                          local_98.x * local_b0.x + local_98.y * local_b0.y) +
              local_58 *
              ABS(local_80.z * local_b0.z + local_80.x * local_b0.x + local_80.y * local_b0.y) +
              local_68 *
              ABS(local_48.z * local_b0.z + local_48.x * local_b0.x + local_48.y * local_b0.y);
      pOVar2 = &local_c8;
      if (dVar5 < dVar4) {
        pOVar2 = &local_b0;
      }
      if (ABS(local_e0.z * local_98.z + local_e0.x * local_98.x + local_98.y * local_e0.y) * dVar3 +
          ABS(local_80.z * local_e0.z + local_80.x * local_e0.x + local_80.y * local_e0.y) *
          local_58 +
          ABS(local_48.z * local_e0.z + local_48.x * local_e0.x + local_48.y * local_e0.y) *
          local_68 <
          (double)(~-(ulong)(dVar5 < dVar4) & (ulong)dVar4 | (ulong)dVar5 & -(ulong)(dVar5 < dVar4))
         ) {
        pOVar2 = &local_e0;
      }
      this->z = pOVar2->z;
      dVar3 = pOVar2->y;
      this->x = pOVar2->x;
      this->y = dVar3;
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
ON_3dVector::PerpendicularTo( 
      const ON_3dPoint& P0, const ON_3dPoint& P1, const ON_3dPoint& P2
      )
{
  // Find a the unit normal to a triangle defined by 3 points
  *this = ON_3dVector::ZeroVector;

  ON_3dVector V0 = P2 - P1;
  ON_3dVector V1 = P0 - P2;
  ON_3dVector V2 = P1 - P0;

  ON_3dVector N0 = ON_CrossProduct( V1, V2 );
  if ( !N0.Unitize() )
    return false;
  ON_3dVector N1 = ON_CrossProduct( V2, V0 );
  if ( !N1.Unitize() )
    return false;
  ON_3dVector N2 = ON_CrossProduct( V0, V1 );
  if ( !N2.Unitize() )
    return false;

  const double s0 = 1.0/V0.Length();
  const double s1 = 1.0/V1.Length();
  const double s2 = 1.0/V2.Length();

  // choose normal with smallest total error
  const double e0 = s0*fabs(ON_DotProduct(N0,V0)) + s1*fabs(ON_DotProduct(N0,V1)) + s2*fabs(ON_DotProduct(N0,V2));
  const double e1 = s0*fabs(ON_DotProduct(N1,V0)) + s1*fabs(ON_DotProduct(N1,V1)) + s2*fabs(ON_DotProduct(N1,V2));
  const double e2 = s0*fabs(ON_DotProduct(N2,V0)) + s1*fabs(ON_DotProduct(N2,V1)) + s2*fabs(ON_DotProduct(N2,V2));

  if ( e0 <= e1 ) {
    if ( e0 <= e2 ) {
      *this = N0;
    }
    else {
      *this = N2;
    }
  }
  else if (e1 <= e2) {
    *this = N1;
  }
  else {
    *this = N2;
  }
  
  return true;
}